

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_intersect.cpp
# Opt level: O2

int ON_Intersect(ON_Arc *A0,ON_Arc *A1,ON_3dPoint *P0,ON_3dPoint *P1)

{
  ON_3dPoint *pOVar1;
  double dVar2;
  double dVar3;
  ON_Arc *this;
  uint uVar4;
  long lVar5;
  double dVar6;
  ON_3dVector *this_00;
  ON_3dVector *v;
  int iVar7;
  int ei;
  ON_3dPoint *P0_00;
  ON_Arc *this_01;
  ulong uVar8;
  bool bVar9;
  ON_Interval OVar10;
  double local_128;
  double LittleEndMatch [2];
  ON_3dPoint LittleEnd;
  double t;
  double local_b8;
  double local_a8;
  ON_3dPoint *local_a0;
  ON_Interval local_98;
  ON_3dPoint *P [2];
  double t_1;
  ON_3dPoint CCX [2];
  
  P1->z = ON_3dPoint::UnsetPoint.z;
  dVar6 = ON_3dPoint::UnsetPoint.y;
  P1->x = ON_3dPoint::UnsetPoint.x;
  P1->y = dVar6;
  dVar2 = ON_3dPoint::UnsetPoint.y;
  dVar6 = ON_3dPoint::UnsetPoint.x;
  P0->z = ON_3dPoint::UnsetPoint.z;
  P0->x = dVar6;
  P0->y = dVar2;
  P[0] = P0;
  P[1] = P1;
  dVar6 = ON_Circle::MaximumCoordinate(&A0->super_ON_Circle);
  dVar2 = ON_Circle::MaximumCoordinate(&A1->super_ON_Circle);
  if (dVar6 <= dVar2) {
    dVar6 = dVar2;
  }
  dVar2 = 2.3283064365386963e-10;
  if (2.3283064365386963e-10 <= dVar6 * 2.2737367544323206e-13) {
    dVar2 = dVar6 * 2.2737367544323206e-13;
  }
  P0_00 = CCX;
  uVar4 = ON_Intersect(&A0->super_ON_Circle,&A1->super_ON_Circle,P0_00,CCX + 1);
  if ((int)uVar4 < 3) {
    iVar7 = 0;
    if ((int)uVar4 < 1) {
      uVar4 = 0;
    }
    uVar8 = (ulong)uVar4;
    while (bVar9 = uVar8 != 0, uVar8 = uVar8 - 1, bVar9) {
      bVar9 = ON_Arc::ClosestPointTo(A0,P0_00,&t);
      if (bVar9) {
        ON_Circle::PointAt(&LittleEnd,&A0->super_ON_Circle,t);
        dVar6 = ON_3dPoint::DistanceTo(P0_00,&LittleEnd);
        if ((dVar6 < dVar2) && (bVar9 = ON_Arc::ClosestPointTo(A1,P0_00,&t), bVar9)) {
          ON_Circle::PointAt(&LittleEnd,&A1->super_ON_Circle,t);
          dVar6 = ON_3dPoint::DistanceTo(P0_00,&LittleEnd);
          if (dVar6 < dVar2) {
            lVar5 = (long)iVar7;
            iVar7 = iVar7 + 1;
            pOVar1 = P[lVar5];
            pOVar1->z = P0_00->z;
            dVar6 = P0_00->y;
            pOVar1->x = P0_00->x;
            pOVar1->y = dVar6;
          }
        }
      }
      P0_00 = P0_00 + 1;
    }
    return iVar7;
  }
  if (uVar4 != 3) {
    return 0;
  }
  local_a0 = P1;
  OVar10 = ON_Arc::Domain(A0);
  LittleEnd.y = OVar10.m_t[1];
  LittleEnd.x = OVar10.m_t[0];
  dVar6 = ON_Interval::Length((ON_Interval *)&LittleEnd);
  OVar10 = ON_Arc::Domain(A1);
  local_b8 = OVar10.m_t[1];
  t = OVar10.m_t[0];
  dVar3 = ON_Interval::Length((ON_Interval *)&t);
  this_01 = A0;
  this = A1;
  if (dVar3 < dVar6) {
    this_01 = A1;
    this = A0;
  }
  OVar10 = ON_Arc::Domain(this);
  local_98.m_t[1] = OVar10.m_t[1];
  local_98.m_t[0] = OVar10.m_t[0];
  local_128 = -dVar2;
  dVar6 = ON_Circle::Radius(&this->super_ON_Circle);
  bVar9 = ON_Interval::Expand(&local_98,local_128 / dVar6);
  if (!bVar9) {
    OVar10 = ON_Arc::Domain(this);
    LittleEnd.y = OVar10.m_t[1];
    LittleEnd.x = OVar10.m_t[0];
    dVar6 = ON_Interval::Mid((ON_Interval *)&LittleEnd);
    OVar10 = ON_Interval::Singleton(dVar6);
    local_98.m_t[1] = OVar10.m_t[1];
    local_98.m_t[0] = OVar10.m_t[0];
  }
  lVar5 = 0;
  do {
    if (lVar5 == 2) {
      if ((LittleEndMatch[0] == 0.5) && (!NAN(LittleEndMatch[0]))) {
        return 3;
      }
      if ((LittleEndMatch[1] == 0.5) && (!NAN(LittleEndMatch[1]))) {
        return 3;
      }
      if ((((LittleEndMatch[0] == -1.0) && (!NAN(LittleEndMatch[0]))) && (LittleEndMatch[1] == -1.0)
          ) && (!NAN(LittleEndMatch[1]))) {
        return 0;
      }
      if ((LittleEndMatch[0] != -1.0) || (NAN(LittleEndMatch[0]))) {
        if ((LittleEndMatch[1] == -1.0) && (!NAN(LittleEndMatch[1]))) {
          ON_Arc::StartPoint(&LittleEnd,this_01);
          P0->z = LittleEnd.z;
          P0->x = LittleEnd.x;
          P0->y = LittleEnd.y;
          return 1;
        }
        local_a8 = LittleEndMatch[1];
        this_00 = ON_Circle::Normal(&A0->super_ON_Circle);
        v = ON_Circle::Normal(&A1->super_ON_Circle);
        dVar6 = ON_3dVector::operator*(this_00,v);
        if ((LittleEndMatch[0] != local_a8) || (NAN(LittleEndMatch[0]) || NAN(local_a8))) {
          if ((LittleEndMatch[0] != 1.0) != 0.0 < dVar6) {
            ON_Arc::StartPoint(&LittleEnd,this_01);
            P0->z = LittleEnd.z;
            P0->x = LittleEnd.x;
            P0->y = LittleEnd.y;
            ON_Arc::EndPoint(&LittleEnd,this_01);
            local_a0->z = LittleEnd.z;
            local_a0->x = LittleEnd.x;
            local_a0->y = LittleEnd.y;
            return 2;
          }
          return 3;
        }
        ON_Arc::StartPoint(&LittleEnd,this_01);
        ON_Arc::EndPoint((ON_3dPoint *)&t,this_01);
        dVar6 = ON_3dPoint::DistanceTo(&LittleEnd,(ON_3dPoint *)&t);
        if (dVar2 <= dVar6) {
          return 3;
        }
        ON_Arc::StartPoint(&LittleEnd,this_01);
      }
      else {
        ON_Arc::EndPoint(&LittleEnd,this_01);
      }
      P0->z = LittleEnd.z;
      P0->x = LittleEnd.x;
      P0->y = LittleEnd.y;
      return 1;
    }
    if (lVar5 == 0) {
      ON_Arc::StartPoint(&LittleEnd,this_01);
    }
    else {
      ON_Arc::EndPoint(&LittleEnd,this_01);
    }
    bVar9 = ON_Arc::ClosestPointTo(this,&LittleEnd,&t_1);
    if (bVar9) {
      iVar7 = ON_Interval::Clamp(&local_98,&t_1);
      if (iVar7 == 1) {
        ON_Arc::EndPoint((ON_3dPoint *)&t,this);
        dVar6 = ON_3dPoint::DistanceTo((ON_3dPoint *)&t,&LittleEnd);
        if (dVar2 <= dVar6) {
LAB_004d69a5:
          dVar6 = -1.0;
        }
        else {
          dVar6 = 1.0;
        }
        LittleEndMatch[lVar5] = dVar6;
      }
      else if (iVar7 == 0) {
        LittleEndMatch[lVar5] = 0.5;
      }
      else if (iVar7 == -1) {
        ON_Arc::StartPoint((ON_3dPoint *)&t,this);
        dVar6 = ON_3dPoint::DistanceTo((ON_3dPoint *)&t,&LittleEnd);
        if (dVar2 <= dVar6) goto LAB_004d69a5;
        LittleEndMatch[lVar5] = 0.0;
      }
    }
    lVar5 = lVar5 + 1;
  } while( true );
}

Assistant:

int ON_Intersect(
  const ON_Arc& A0,
  const ON_Arc& A1,
  ON_3dPoint& P0,
  ON_3dPoint& P1)
{
  P0 = P1 = ON_3dPoint::UnsetPoint;
  ON_3dPoint* P[] = { &P0, &P1 };
  int xcnt = 0;

  double scale0 = A0.MaximumCoordinate();
  double abstol = A1.MaximumCoordinate();
  if (abstol < scale0)
    abstol = scale0;
  abstol *= ON_RELATIVE_TOLERANCE;
  if (abstol < ON_ZERO_TOLERANCE)
    abstol = ON_ZERO_TOLERANCE;


  ON_3dPoint CCX[2];
  int cxcnt = ON_Intersect(static_cast<const ON_Circle&>(A0), static_cast<const ON_Circle&>(A1), CCX[0], CCX[1]);
  if ( cxcnt < 3)
  {
    for (int i = 0; i < cxcnt; i++)
    {
      double t;
      if (A0.ClosestPointTo(CCX[i], &t))
      {
        if (CCX[i].DistanceTo(A0.PointAt(t)) < abstol)
        {
          if (A1.ClosestPointTo(CCX[i], &t))
          {
            if (CCX[i].DistanceTo(A1.PointAt(t)) < abstol)
              *P[xcnt++] = CCX[i];
          }
        }
      }
    }
  }
  else if (cxcnt == 3)
  {
    // circle doesn't degenerate to a point
    // order arcs by size
    const  ON_Arc* Size[] = { &A0, &A1 };     //Size[0]<=Size[1]
    if (A0.Domain().Length() > A1.Domain().Length())
    {
      Size[0] = &A1;
      Size[1] = &A0;
    }

    // Match ends of smaller to larger arc
    double LittleEndMatch[2];  // relative to Big ArcBig,  0-start, 1-end , .5 (interior),  -1 ( exterior)

    ON_Interval BigInterior = Size[1]->Domain();    // interior domain of big arc
    if (!BigInterior.Expand(-abstol / Size[1]->Radius()))         // circles are not degenerate
      BigInterior = ON_Interval::Singleton(Size[1]->Domain().Mid());
    
    for (int ei = 0; ei < 2; ei++)
    {
      double t;
      ON_3dPoint LittleEnd = ei ? Size[0]->EndPoint() : Size[0]->StartPoint();
      if (Size[1]->ClosestPointTo(LittleEnd, &t))
      {
        switch (BigInterior.Clamp(t))
        {
        case(-1):
          if (Size[1]->StartPoint().DistanceTo(LittleEnd) < abstol)
            LittleEndMatch[ei] = 0;   // start
          else
            LittleEndMatch[ei] = -1;  // exterior
          break;
        case(0):
          LittleEndMatch[ei] = .5;    // interior
          break;
        case(1):
          if (Size[1]->EndPoint().DistanceTo(LittleEnd) < abstol)
            LittleEndMatch[ei] = 1;       // end
          else
            LittleEndMatch[ei] = -1;     // exterior
          break;
        }
      }
    }

    if (LittleEndMatch[0] == .5 || LittleEndMatch[1] == .5)
      xcnt = 3;     // an interior match means an overlap
    else if (LittleEndMatch[0] == -1 && LittleEndMatch[1] == -1)
      xcnt = 0;     // both points exterior means  intersection is empty
    else if (LittleEndMatch[0] == -1)
      *P[xcnt++] = Size[0]->EndPoint();    // if start is exterior end must be an intersection point
    else if (LittleEndMatch[1] == -1)
      *P[xcnt++] = Size[0]->StartPoint();
    else
    {
      // Both endpoints match endpoints of Big
      // LittleEndMatch[ei] \in { 0, 1 }
      bool Orientation_agree = (A0.Normal() * A1.Normal() > 0);     // true if  the orientations agree
      if (LittleEndMatch[0] != LittleEndMatch[1])
      {
        if (Orientation_agree == (LittleEndMatch[0] == 1.0))
        {
          *P[xcnt++] = Size[0]->StartPoint();
          *P[xcnt++] = Size[0]->EndPoint();
        }
        else
          xcnt = 3;
      }
      else
      {
        // Degenerate cases
        if (Size[0]->StartPoint().DistanceTo(Size[0]->EndPoint()) < abstol)
          *P[xcnt++] = Size[0]->StartPoint();
        else
          xcnt = 3;
      }
    }
  }
  
  return xcnt;
}